

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void compute_sorted_huffman(Codebook *c,uint8 *lengths,uint32 *values)

{
  byte bVar1;
  code *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  SDL_AssertState sdl_assert_state_1;
  int m;
  int n;
  int x;
  uint32 code;
  int huff_len;
  SDL_AssertState sdl_assert_state;
  int k;
  int len;
  int i;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar7;
  int local_38;
  int local_34;
  int local_24;
  int local_1c;
  
  if (*(char *)(in_RDI + 0x1b) == '\0') {
    local_24 = 0;
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 4); local_1c = local_1c + 1) {
      iVar3 = include_in_sort((Codebook *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),'\0');
      if (iVar3 != 0) {
        uVar4 = bit_reverse(*(uint *)(*(long *)(in_RDI + 0x28) + (long)local_1c * 4));
        *(uint *)(*(long *)(in_RDI + 0x830) + (long)local_24 * 4) = uVar4;
        local_24 = local_24 + 1;
      }
    }
    do {
      if (local_24 == *(int *)(in_RDI + 0x840)) goto LAB_00144831;
      iVar3 = SDL_ReportAssertion(&compute_sorted_huffman::sdl_assert_data,"compute_sorted_huffman",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                  ,0x4a0);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
  }
  else {
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x840); local_1c = local_1c + 1) {
      uVar4 = bit_reverse(*(uint *)(*(long *)(in_RDI + 0x28) + (long)local_1c * 4));
      *(uint *)(*(long *)(in_RDI + 0x830) + (long)local_1c * 4) = uVar4;
    }
  }
LAB_00144831:
  SDL_qsort(*(undefined8 *)(in_RDI + 0x830),(long)*(int *)(in_RDI + 0x840),4,uint32_compare);
  *(undefined4 *)(*(long *)(in_RDI + 0x830) + (long)*(int *)(in_RDI + 0x840) * 4) = 0xffffffff;
  if (*(char *)(in_RDI + 0x1b) == '\0') {
    iVar3 = *(int *)(in_RDI + 4);
  }
  else {
    iVar3 = *(int *)(in_RDI + 0x840);
  }
  local_1c = 0;
  iVar7 = iVar3;
  do {
    if (iVar3 <= local_1c) {
      return;
    }
    if (*(char *)(in_RDI + 0x1b) == '\0') {
      bVar1 = *(byte *)(in_RSI + local_1c);
    }
    else {
      bVar1 = *(byte *)(in_RSI + (ulong)*(uint *)(in_RDX + (long)local_1c * 4));
    }
    iVar5 = include_in_sort((Codebook *)CONCAT44(iVar7,(uint)bVar1),'\0');
    if (iVar5 != 0) {
      uVar4 = bit_reverse(*(uint *)(*(long *)(in_RDI + 0x28) + (long)local_1c * 4));
      local_34 = 0;
      iVar5 = *(int *)(in_RDI + 0x840);
      while (local_38 = iVar5, 1 < local_38) {
        iVar6 = local_38 >> 1;
        iVar5 = iVar6;
        if (*(uint *)(*(long *)(in_RDI + 0x830) + (long)(local_34 + iVar6) * 4) <= uVar4) {
          iVar5 = local_38 - iVar6;
          local_34 = local_34 + iVar6;
        }
      }
      do {
        if (*(uint *)(*(long *)(in_RDI + 0x830) + (long)local_34 * 4) == uVar4) goto LAB_00144a04;
        iVar5 = SDL_ReportAssertion(&compute_sorted_huffman::sdl_assert_data_1,
                                    "compute_sorted_huffman",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                    ,0x4be);
      } while (iVar5 == 0);
      if (iVar5 == 1) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
LAB_00144a04:
      if (*(char *)(in_RDI + 0x1b) == '\0') {
        *(int *)(*(long *)(in_RDI + 0x838) + (long)local_34 * 4) = local_1c;
      }
      else {
        *(undefined4 *)(*(long *)(in_RDI + 0x838) + (long)local_34 * 4) =
             *(undefined4 *)(in_RDX + (long)local_1c * 4);
        *(byte *)(*(long *)(in_RDI + 8) + (long)local_34) = bVar1;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static void compute_sorted_huffman(Codebook *c, uint8 *lengths, uint32 *values)
{
   int i, len;
   // build a list of all the entries
   // OPTIMIZATION: don't include the short ones, since they'll be caught by FAST_HUFFMAN.
   // this is kind of a frivolous optimization--I don't see any performance improvement,
   // but it's like 4 extra lines of code, so.
   if (!c->sparse) {
      int k = 0;
      for (i=0; i < c->entries; ++i)
         if (include_in_sort(c, lengths[i]))
            c->sorted_codewords[k++] = bit_reverse(c->codewords[i]);
      assert(k == c->sorted_entries);
   } else {
      for (i=0; i < c->sorted_entries; ++i)
         c->sorted_codewords[i] = bit_reverse(c->codewords[i]);
   }

   qsort(c->sorted_codewords, c->sorted_entries, sizeof(c->sorted_codewords[0]), uint32_compare);
   c->sorted_codewords[c->sorted_entries] = 0xffffffff;

   len = c->sparse ? c->sorted_entries : c->entries;
   // now we need to indicate how they correspond; we could either
   //   #1: sort a different data structure that says who they correspond to
   //   #2: for each sorted entry, search the original list to find who corresponds
   //   #3: for each original entry, find the sorted entry
   // #1 requires extra storage, #2 is slow, #3 can use binary search!
   for (i=0; i < len; ++i) {
      int huff_len = c->sparse ? lengths[values[i]] : lengths[i];
      if (include_in_sort(c,huff_len)) {
         uint32 code = bit_reverse(c->codewords[i]);
         int x=0, n=c->sorted_entries;
         while (n > 1) {
            // invariant: sc[x] <= code < sc[x+n]
            int m = x + (n >> 1);
            if (c->sorted_codewords[m] <= code) {
               x = m;
               n -= (n>>1);
            } else {
               n >>= 1;
            }
         }
         assert(c->sorted_codewords[x] == code);
         if (c->sparse) {
            c->sorted_values[x] = values[i];
            c->codeword_lengths[x] = huff_len;
         } else {
            c->sorted_values[x] = i;
         }
      }
   }
}